

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool-inl.h
# Opt level: O0

bool __thiscall spdlog::details::thread_pool::process_next_msg_(thread_pool *this)

{
  async_msg *in_RDI;
  bool dequeued;
  async_msg incoming_async_msg;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffe30;
  int local_1c4;
  duration<long,std::ratio<1l,1l>> local_1c0 [23];
  undefined1 local_1a9;
  async_msg *in_stack_fffffffffffffe58;
  mpmc_blocking_queue<spdlog::details::async_msg> *in_stack_fffffffffffffe60;
  milliseconds in_stack_fffffffffffffe68;
  log_msg *in_stack_fffffffffffffeb8;
  async_logger *in_stack_fffffffffffffec0;
  int local_28;
  bool local_1;
  
  async_msg::async_msg(in_RDI);
  local_1c4 = 10;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_1c0,&local_1c4);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1l>,void>
            (in_stack_fffffffffffffe30,
             (duration<long,_std::ratio<1L,_1L>_> *)
             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_1a9 = mpmc_blocking_queue<spdlog::details::async_msg>::dequeue_for
                        (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                         in_stack_fffffffffffffe68);
  if ((bool)local_1a9) {
    if (local_28 == 0) {
      std::__shared_ptr_access<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x215d3e);
      async_logger::backend_sink_it_(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      local_1 = true;
    }
    else if (local_28 == 1) {
      std::__shared_ptr_access<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<spdlog::async_logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x215d6c);
      async_logger::backend_flush_(in_stack_fffffffffffffec0);
      local_1 = true;
    }
    else if (local_28 == 2) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  async_msg::~async_msg(in_RDI);
  return local_1;
}

Assistant:

bool SPDLOG_INLINE thread_pool::process_next_msg_()
{
    async_msg incoming_async_msg;
    bool dequeued = q_.dequeue_for(incoming_async_msg, std::chrono::seconds(10));
    if (!dequeued)
    {
        return true;
    }

    switch (incoming_async_msg.msg_type)
    {
    case async_msg_type::log: {
        incoming_async_msg.worker_ptr->backend_sink_it_(incoming_async_msg);
        return true;
    }
    case async_msg_type::flush: {
        incoming_async_msg.worker_ptr->backend_flush_();
        return true;
    }

    case async_msg_type::terminate: {
        return false;
    }

    default: {
        assert(false && "Unexpected async_msg_type");
    }
    }

    return true;
}